

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartThreading.cpp
# Opt level: O3

void anon_unknown.dwarf_234a9a::fillPixels<Imath_3_2::half>
               (Array2D<Imath_3_2::half> *ph,int width,int height)

{
  long lVar1;
  half *phVar2;
  ulong uVar3;
  
  lVar1 = (long)height * (long)width;
  uVar3 = 0xffffffffffffffff;
  if (-1 < lVar1) {
    uVar3 = lVar1 * 2;
  }
  phVar2 = (half *)operator_new__(uVar3);
  if (ph->_data != (half *)0x0) {
    operator_delete__(ph->_data);
  }
  ph->_sizeX = (long)height;
  ph->_sizeY = (long)width;
  ph->_data = phVar2;
  if (0 < height) {
    uVar3 = 0;
    do {
      if (0 < width) {
        (anonymous_namespace)::fillPixels<Imath_3_2::half>();
      }
      uVar3 = uVar3 + 1;
    } while ((uint)height != uVar3);
  }
  return;
}

Assistant:

void
fillPixels (Array2D<T>& ph, int width, int height)
{
    ph.resizeErase (height, width);
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            //
            // We do this because half cannot store number bigger than 2048 exactly.
            //
            ph[y][x] = (y * width + x) % 2049;
        }
}